

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_descriptor_checksum(char *descriptor,char *checksum)

{
  size_t sVar1;
  uint64_t c;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  int val;
  
  sVar1 = strlen(descriptor);
  if (sVar1 == 0) {
    c = 1;
  }
  else {
    sVar6 = 0;
    c = 1;
    val = 0;
    iVar3 = 0;
    do {
      while( true ) {
        iVar2 = iVar3;
        uVar5 = 0;
        while (descriptor[sVar6] !=
               "0123456789()[],\'/*abcdefgh@:$%{}IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~ijklmnopqrstuvwxyzABCDEFGH`#\"\\ "
               [uVar5]) {
          uVar5 = uVar5 + 1;
          if (uVar5 == 0x5f) {
            return -2;
          }
        }
        c = poly_mod_descriptor_checksum(c,(uint)uVar5 & 0x1f);
        val = (int)(uVar5 >> 5) + val * 3;
        iVar3 = iVar2 + 1;
        if (iVar3 == 3) break;
        sVar6 = sVar6 + 1;
        if (sVar6 == sVar1) {
          if (-1 < iVar2) {
            c = poly_mod_descriptor_checksum(c,val);
          }
          goto LAB_004a0d59;
        }
      }
      c = poly_mod_descriptor_checksum(c,val);
      sVar6 = sVar6 + 1;
      val = 0;
      iVar3 = 0;
    } while (sVar6 != sVar1);
  }
LAB_004a0d59:
  iVar3 = 8;
  do {
    c = poly_mod_descriptor_checksum(c,0);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  lVar4 = 0x23;
  do {
    *checksum = "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[(uint)((c ^ 1) >> ((byte)lVar4 & 0x3f)) & 0x1f];
    lVar4 = lVar4 + -5;
    checksum = checksum + 1;
  } while (lVar4 != -5);
  return 0;
}

Assistant:

static int generate_descriptor_checksum(const char *descriptor, char *checksum)
{
    /*
     * base:
     * bitcoin/src/script/descriptor.cpp
     * std::string DescriptorChecksum(const Span<const char>& span)
     */

    /** A character set designed such that:
     *  - The most common 'unprotected' descriptor characters (hex, keypaths) are in the first group of 32.
     *  - Case errors cause an offset that's a multiple of 32.
     *  - As many alphabetic characters are in the same group (while following the above restrictions).
     *
     * If p(x) gives the position of a character c in this character set, every group of 3 characters
     * (a,b,c) is encoded as the 4 symbols (p(a) & 31, p(b) & 31, p(c) & 31, (p(a) / 32) + 3 * (p(b) / 32) + 9 * (p(c) / 32).
     * This means that changes that only affect the lower 5 bits of the position, or only the higher 2 bits, will just
     * affect a single symbol.
     *
     * As a result, within-group-of-32 errors count as 1 symbol, as do cross-group errors that don't affect
     * the position within the groups.
     */
    static const char *input_charset =
        "0123456789()[],'/*abcdefgh@:$%{}"
        "IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~"
        "ijklmnopqrstuvwxyzABCDEFGH`#\"\\ ";

    /* The character set for the checksum itself (same as bech32). */
    static const char *checksum_charset =
        "qpzry9x8gf2tvdw0s3jn54khce6mua7l";

    uint64_t c = 1;
    int cls = 0;
    int clscount = 0;
    int j;
    char ch;
    size_t pos;
    size_t max = strlen(input_charset);
    size_t idx;

    for (idx = 0; idx < strlen(descriptor); ++idx) {
        ch = descriptor[idx];
        for (pos = 0; pos < max; ++pos) {
            if (ch == input_charset[pos])
                break;
        }
        if (pos == max)
            return WALLY_EINVAL;
        /* Emit a symbol for the position inside the group, for every character. */
        c = poly_mod_descriptor_checksum(c, pos & 31);
        /* Accumulate the group numbers */
        cls = cls * 3 + (int)(pos >> 5);
        if (++clscount == 3) {
            /* Emit an extra symbol representing the group numbers, for every 3 characters. */
            c = poly_mod_descriptor_checksum(c, cls);
            cls = 0;
            clscount = 0;
        }
    }
    if (clscount > 0)
        c = poly_mod_descriptor_checksum(c, cls);
    for (j = 0; j < 8; ++j)
        c = poly_mod_descriptor_checksum(c, 0);
    c ^= 1;

    for (j = 0; j < DESCRIPTOR_CHECKSUM_LENGTH; ++j)
        checksum[j] = checksum_charset[(c >> (5 * (7 - j))) & 31];

    return WALLY_OK;
}